

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glad.c
# Opt level: O2

int has_ext(char *ext)

{
  GLint GVar1;
  GLuint GVar2;
  int iVar3;
  GLubyte *__s1;
  byte *__haystack;
  byte *pbVar4;
  size_t sVar5;
  byte *pbVar6;
  GLuint GVar7;
  uint uVar8;
  GLint num_exts;
  
  if ((GLVersion.major < 3) || (glad_glGetStringi == (PFNGLGETSTRINGIPROC)0x0)) {
    __haystack = (*glad_glGetString)(0x1f03);
    uVar8 = 0;
    if (ext != (char *)0x0 && __haystack != (byte *)0x0) {
      do {
        pbVar4 = (byte *)strstr((char *)__haystack,ext);
        if (pbVar4 == (byte *)0x0) {
          return 0;
        }
        sVar5 = strlen(ext);
        pbVar6 = pbVar4 + sVar5;
      } while (((pbVar4 != __haystack) && (__haystack = pbVar6, pbVar4[-1] != 0x20)) ||
              (__haystack = pbVar6, (*pbVar6 & 0xdf) != 0));
      uVar8 = 1;
    }
  }
  else {
    (*glad_glGetIntegerv)(0x821d,&num_exts);
    GVar2 = 0;
    do {
      GVar7 = GVar2;
      GVar1 = num_exts;
      if (num_exts <= (int)GVar7) break;
      __s1 = (*glad_glGetStringi)(0x1f03,GVar7);
      iVar3 = strcmp((char *)__s1,ext);
      GVar2 = GVar7 + 1;
    } while (iVar3 != 0);
    uVar8 = (uint)((int)GVar7 < GVar1);
  }
  return uVar8;
}

Assistant:

static int has_ext(const char *ext) {
#if defined(GL_VERSION_3_0) || defined(GL_ES_VERSION_3_0)
    if(GLVersion.major < 3 || glGetStringi == NULL) {
#endif
        const char *extensions;
        const char *loc;
        const char *terminator;
        extensions = (const char*) glGetString(GL_EXTENSIONS);
        if(extensions == NULL || ext == NULL) {
            return 0;
        }

        while(1) {
            loc = strstr(extensions, ext);
            if(loc == NULL) {
                return 0;
            }

            terminator = loc + strlen(ext);
            if((loc == extensions || *(loc - 1) == ' ') &&
                (*terminator == ' ' || *terminator == '\0')) {
                return 1;
            }
            extensions = terminator;
        }
#if defined(GL_VERSION_3_0) || defined(GL_ES_VERSION_3_0)
    } else {
        GLint num_exts, index;

        glGetIntegerv(GL_NUM_EXTENSIONS, &num_exts);
        for(index = 0; index < num_exts; index++) {
            if(strcmp((const char*) glGetStringi(GL_EXTENSIONS, index), ext) == 0) {
                return 1;
            }
        }
    }
#endif

    return 0;
}